

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

int amqp_send_frame_inner
              (amqp_connection_state_t state,amqp_frame_t *frame,int flags,amqp_time_t deadline)

{
  amqp_time_t deadline_00;
  int iVar1;
  amqp_time_t l;
  amqp_time_t in_RCX;
  undefined4 in_EDX;
  amqp_connection_state_t in_RDI;
  amqp_connection_state_t in_stack_00000008;
  amqp_time_t next_timeout;
  amqp_bytes_t encoded;
  ssize_t sent;
  int res;
  amqp_connection_state_t in_stack_ffffffffffffffc0;
  amqp_time_t *in_stack_ffffffffffffffc8;
  amqp_connection_state_t in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  int local_4;
  
  local_4 = amqp_frame_to_bytes((amqp_frame_t *)encoded.len,stack0x00000020,
                                (amqp_bytes_t *)next_timeout.time_point_ns);
  if (local_4 == 0) {
    while( true ) {
      uVar2 = 0;
      l = amqp_time_first(in_RCX,(in_RDI->next_recv_heartbeat).time_point_ns);
      deadline_00.time_point_ns._4_4_ = in_EDX;
      deadline_00.time_point_ns._0_4_ = uVar2;
      in_stack_ffffffffffffffd0 =
           (amqp_connection_state_t)
           amqp_try_send(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         (size_t)in_stack_ffffffffffffffc0,deadline_00,
                         (int)(l.time_point_ns >> 0x20));
      if ((long)in_stack_ffffffffffffffd0 < 0) break;
      if (in_stack_ffffffffffffffc0 == in_stack_ffffffffffffffd0) {
        amqp_heartbeat_send(in_RDI);
        iVar1 = amqp_time_s_from_now
                          (in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20)
                          );
        return iVar1;
      }
      iVar1 = amqp_time_equal(l,in_RCX);
      if (iVar1 != 0) {
        return -0xd;
      }
      iVar1 = amqp_try_recv(in_stack_00000008);
      if (iVar1 == -0xd) {
        return -0xf;
      }
      if (iVar1 != 0) {
        return iVar1;
      }
      in_stack_ffffffffffffffc8 =
           (amqp_time_t *)
           ((long)in_stack_ffffffffffffffd0->pool_table +
           (long)&in_stack_ffffffffffffffc8->time_point_ns);
      in_stack_ffffffffffffffc0 =
           (amqp_connection_state_t)
           ((long)in_stack_ffffffffffffffc0 - (long)in_stack_ffffffffffffffd0);
    }
    local_4 = (int)in_stack_ffffffffffffffd0;
  }
  return local_4;
}

Assistant:

int amqp_send_frame_inner(amqp_connection_state_t state,
                          const amqp_frame_t *frame, int flags,
                          amqp_time_t deadline) {
  int res;
  ssize_t sent;
  amqp_bytes_t encoded;
  amqp_time_t next_timeout;

  /* TODO: if the AMQP_SF_MORE socket optimization can be shown to work
   * correctly, then this could be un-done so that body-frames are sent as 3
   * send calls, getting rid of the copy of the body content, some testing
   * would need to be done to see if this would actually a win for performance.
   * */
  res = amqp_frame_to_bytes(frame, state->outbound_buffer, &encoded);
  if (AMQP_STATUS_OK != res) {
    return res;
  }

start_send:

  next_timeout = amqp_time_first(deadline, state->next_recv_heartbeat);

  sent = amqp_try_send(state, encoded.bytes, encoded.len, next_timeout, flags);
  if (0 > sent) {
    return (int)sent;
  }

  /* A partial send has occurred, because of a heartbeat timeout (so try recv
   * something) or common timeout (so return AMQP_STATUS_TIMEOUT) */
  if ((ssize_t)encoded.len != sent) {
    if (amqp_time_equal(next_timeout, deadline)) {
      /* timeout of method was received, so return from method*/
      return AMQP_STATUS_TIMEOUT;
    }

    res = amqp_try_recv(state);

    if (AMQP_STATUS_TIMEOUT == res) {
      return AMQP_STATUS_HEARTBEAT_TIMEOUT;
    } else if (AMQP_STATUS_OK != res) {
      return res;
    }

    encoded.bytes = (uint8_t *)encoded.bytes + sent;
    encoded.len -= sent;
    goto start_send;
  }

  res = amqp_time_s_from_now(&state->next_send_heartbeat,
                             amqp_heartbeat_send(state));
  return res;
}